

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void EDCircles::jacobi(double **a,int n,double *d,double **v,int nrot)

{
  size_t __n;
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  void *__s;
  void *__s_00;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  double **ppdVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  uint local_8c;
  
  __n = (long)(int)(n + 1U) * 8;
  uVar9 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar9 = __n;
  }
  __s = operator_new__(uVar9);
  __s_00 = operator_new__(uVar9);
  memset(__s,0,__n);
  memset(__s_00,0,__n);
  uVar9 = (ulong)(uint)n;
  uVar17 = (ulong)(n + 1U);
  if (0 < n) {
    uVar18 = 1;
    do {
      pdVar1 = v[uVar18];
      memset(pdVar1 + 1,0,uVar9 * 8);
      pdVar1[uVar18] = 1.0;
      uVar18 = uVar18 + 1;
    } while (uVar17 != uVar18);
    if (0 < n) {
      uVar18 = 1;
      do {
        dVar19 = a[uVar18][uVar18];
        d[uVar18] = dVar19;
        *(double *)((long)__s + uVar18 * 8) = dVar19;
        *(undefined8 *)((long)__s_00 + uVar18 * 8) = 0;
        uVar18 = uVar18 + 1;
      } while (uVar17 != uVar18);
    }
  }
  local_8c = 1;
  do {
    if (n < 2) break;
    dVar19 = 0.0;
    uVar4 = 1;
    lVar11 = 0;
    uVar18 = uVar17;
    do {
      ppdVar15 = a + uVar4;
      uVar4 = uVar4 + 1;
      uVar13 = 2;
      do {
        dVar19 = dVar19 + ABS(*(double *)((long)*ppdVar15 + uVar13 * 8 + lVar11));
        uVar13 = uVar13 + 1;
      } while (uVar18 != uVar13);
      lVar11 = lVar11 + 8;
      uVar18 = uVar18 - 1;
    } while (uVar4 != uVar9);
    if ((dVar19 == 0.0) && (!NAN(dVar19))) break;
    if (local_8c < 4) {
      dVar19 = (dVar19 * 0.2) / (double)(n * n);
    }
    else {
      dVar19 = 0.0;
    }
    if (1 < n) {
      uVar4 = 2;
      lVar11 = 0x10;
      lVar5 = 0x18;
      lVar16 = 0;
      uVar18 = 1;
      ppdVar15 = a + 2;
      do {
        uVar13 = uVar18 + 1;
        pdVar1 = a[uVar18];
        lVar12 = (long)pdVar1 + lVar5;
        lVar6 = 0;
        uVar10 = uVar4;
        lVar14 = lVar5;
        do {
          dVar23 = pdVar1[uVar10];
          dVar20 = ABS(dVar23) * 100.0;
          if (((local_8c < 5) || (dVar20 != 0.0)) || (NAN(dVar20))) {
            if (dVar19 < ABS(dVar23)) {
              dVar22 = d[uVar18];
              dVar21 = d[uVar10] - dVar22;
              if ((dVar20 != 0.0) || (NAN(dVar20))) {
                dVar20 = (dVar21 * 0.5) / dVar23;
                dVar23 = 1.0 / (SQRT(dVar20 * dVar20 + 1.0) + ABS(dVar20));
                if (dVar20 < 0.0) {
                  dVar23 = -dVar23;
                }
              }
              else {
                dVar23 = dVar23 / dVar21;
              }
              dVar21 = 1.0 / SQRT(dVar23 * dVar23 + 1.0);
              dVar20 = dVar23 * dVar21;
              dVar23 = dVar23 * pdVar1[uVar10];
              *(double *)((long)__s_00 + uVar18 * 8) =
                   *(double *)((long)__s_00 + uVar18 * 8) - dVar23;
              *(double *)((long)__s_00 + uVar10 * 8) =
                   *(double *)((long)__s_00 + uVar10 * 8) + dVar23;
              d[uVar18] = dVar22 - dVar23;
              dVar22 = dVar20 / (dVar21 + 1.0);
              d[uVar10] = dVar23 + d[uVar10];
              pdVar1[uVar10] = 0.0;
              if (1 < uVar18) {
                lVar7 = 0;
                do {
                  lVar2 = *(long *)((long)a + lVar7 + 8);
                  dVar23 = *(double *)(lVar2 + uVar18 * 8);
                  dVar21 = *(double *)(lVar2 + uVar10 * 8);
                  *(double *)(lVar2 + uVar18 * 8) = (dVar23 * dVar22 + dVar21) * -dVar20 + dVar23;
                  *(double *)(lVar2 + uVar10 * 8) = (dVar23 - dVar21 * dVar22) * dVar20 + dVar21;
                  lVar7 = lVar7 + 8;
                } while (lVar16 != lVar7);
              }
              if (uVar13 < uVar10) {
                lVar7 = 0;
                do {
                  dVar23 = *(double *)((long)pdVar1 + lVar7 * 8 + lVar11);
                  pdVar3 = ppdVar15[lVar7];
                  dVar21 = pdVar3[uVar10];
                  *(double *)((long)pdVar1 + lVar7 * 8 + lVar11) =
                       (dVar23 * dVar22 + dVar21) * -dVar20 + dVar23;
                  pdVar3[uVar10] = (dVar23 - dVar21 * dVar22) * dVar20 + dVar21;
                  lVar7 = lVar7 + 1;
                } while (lVar6 != lVar7);
              }
              if ((long)uVar10 < (long)n) {
                pdVar3 = a[uVar10];
                lVar7 = 0;
                do {
                  dVar23 = *(double *)(lVar12 + lVar7 * 8);
                  dVar21 = *(double *)((long)pdVar3 + lVar7 * 8 + lVar14);
                  *(double *)(lVar12 + lVar7 * 8) = (dVar23 * dVar22 + dVar21) * -dVar20 + dVar23;
                  *(double *)((long)pdVar3 + lVar7 * 8 + lVar14) =
                       (dVar23 - dVar21 * dVar22) * dVar20 + dVar21;
                  lVar7 = lVar7 + 1;
                } while ((int)lVar7 + (int)uVar10 < n);
              }
              uVar8 = 1;
              do {
                pdVar3 = v[uVar8];
                dVar23 = pdVar3[uVar18];
                dVar21 = pdVar3[uVar10];
                pdVar3[uVar18] = (dVar23 * dVar22 + dVar21) * -dVar20 + dVar23;
                pdVar3[uVar10] = (dVar23 - dVar21 * dVar22) * dVar20 + dVar21;
                uVar8 = uVar8 + 1;
              } while (uVar17 != uVar8);
            }
          }
          else {
            pdVar1[uVar10] = 0.0;
          }
          uVar10 = uVar10 + 1;
          lVar6 = lVar6 + 1;
          lVar14 = lVar14 + 8;
          lVar12 = lVar12 + 8;
        } while (uVar10 != uVar17);
        uVar4 = uVar4 + 1;
        lVar16 = lVar16 + 8;
        ppdVar15 = ppdVar15 + 1;
        lVar11 = lVar11 + 8;
        lVar5 = lVar5 + 8;
        uVar18 = uVar13;
      } while (uVar13 != uVar9);
    }
    if (0 < n) {
      uVar18 = 1;
      do {
        dVar19 = *(double *)((long)__s_00 + uVar18 * 8) + *(double *)((long)__s + uVar18 * 8);
        *(double *)((long)__s + uVar18 * 8) = dVar19;
        d[uVar18] = dVar19;
        *(undefined8 *)((long)__s_00 + uVar18 * 8) = 0;
        uVar18 = uVar18 + 1;
      } while (uVar17 != uVar18);
    }
    local_8c = local_8c + 1;
  } while (local_8c != 0x33);
  operator_delete__(__s);
  operator_delete__(__s_00);
  return;
}

Assistant:

void EDCircles::jacobi(double ** a, int n, double d[], double ** v, int nrot)
{
	int j, iq, ip, i;
	double tresh, theta, tau, t, sm, s, h, g, c;

	double *b = new double[n + 1];
	double *z = new double[n + 1];
	memset(b, 0, sizeof(double)*(n + 1));
	memset(z, 0, sizeof(double)*(n + 1));

	for (ip = 1; ip <= n; ip++)
	{
		for (iq = 1; iq <= n; iq++) v[ip][iq] = 0.0;
		v[ip][ip] = 1.0;
	}
	for (ip = 1; ip <= n; ip++)
	{
		b[ip] = d[ip] = a[ip][ip];
		z[ip] = 0.0;
	}
	nrot = 0;
	for (i = 1; i <= 50; i++)
	{
		sm = 0.0;
		for (ip = 1; ip <= n - 1; ip++)
		{
			for (iq = ip + 1; iq <= n; iq++)
				sm += fabs(a[ip][iq]);
		}
		if (sm == 0.0)
		{
			delete[] b;
			delete[] z;
			return;
		}
		if (i < 4)
			tresh = 0.2 * sm / (n * n);
		else
			tresh = 0.0;
		for (ip = 1; ip <= n - 1; ip++)
		{
			for (iq = ip + 1; iq <= n; iq++)
			{
				g = 100.0 * fabs(a[ip][iq]);
				//				if (i > 4 && fabs(d[ip]) + g == fabs(d[ip])
				//				&& fabs(d[iq]) + g == fabs(d[iq]))

				if (i > 4 && g == 0.0)
					a[ip][iq] = 0.0;
				else if (fabs(a[ip][iq]) > tresh)
				{
					h = d[iq] - d[ip];
					if (g == 0.0)
						t = (a[ip][iq]) / h;
					else
					{
						theta = 0.5 * h / (a[ip][iq]);
						t = 1.0 / (fabs(theta) + sqrt(1.0 + theta * theta));
						if (theta < 0.0) t = -t;
					}
					c = 1.0 / sqrt(1 + t * t);
					s = t * c;
					tau = s / (1.0 + c);
					h = t * a[ip][iq];
					z[ip] -= h;
					z[iq] += h;
					d[ip] -= h;
					d[iq] += h;
					a[ip][iq] = 0.0;
					for (j = 1; j <= ip - 1; j++)
					{
						ROTATE(a, j, ip, j, iq, tau, s);
					}
					for (j = ip + 1; j <= iq - 1; j++)
					{
						ROTATE(a, ip, j, j, iq, tau, s);
					}
					for (j = iq + 1; j <= n; j++)
					{
						ROTATE(a, ip, j, iq, j, tau, s);
					}
					for (j = 1; j <= n; j++)
					{
						ROTATE(v, j, ip, j, iq, tau, s);
					}
					++nrot;
				}
			}
		}
		for (ip = 1; ip <= n; ip++)
		{
			b[ip] += z[ip];
			d[ip] = b[ip];
			z[ip] = 0.0;
		}
	}
	//printf("Too many iterations in routine JACOBI");
	delete[] b;
	delete[] z;
}